

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O0

int __thiscall Nova::Parse_Args::Find_Match(Parse_Args *this,string *str,Type *type)

{
  int iVar1;
  ostream *poVar2;
  const_reference pvVar3;
  int match;
  Type *type_local;
  string *str_local;
  Parse_Args *this_local;
  
  iVar1 = Find_Match(this,str);
  if (iVar1 < 0) {
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cout,"Argument ");
    poVar2 = std::operator<<(poVar2,(string *)str);
    poVar2 = std::operator<<(poVar2," undeclared");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  pvVar3 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::operator[]
                     (&this->arg_data_list,(long)iVar1);
  if (pvVar3->type != *type) {
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cout,"Type mismatch in Find_Match(");
    poVar2 = std::operator<<(poVar2,(string *)str);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  return iVar1;
}

Assistant:

int Parse_Args::
Find_Match(const std::string& str,const Arg_Data::Type& type) const
{
    int match=Find_Match(str);
    if(match<0)
    {
        Log::cout<<"Argument "<<str<<" undeclared"<<std::endl;
        exit(-1);
    }

    if(arg_data_list[match].type!=type)
    {
        Log::cout<<"Type mismatch in Find_Match("<<str<<")"<<std::endl;
        exit(-1);
    }
    return match;
}